

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddTransactionInput
              (void *handle,void *create_handle,char *txid,uint32_t vout,uint32_t sequence)

{
  ConfidentialTransaction *this;
  bool bVar1;
  CfdException *pCVar2;
  TransactionContext *tx;
  allocator local_6a;
  bool is_bitcoin;
  undefined1 local_68 [32];
  string local_48;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_68,"TransactionData",(allocator *)&local_48);
  cfd::capi::CheckBuffer(create_handle,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    local_68._0_8_ = "cfdcapi_transaction.cpp";
    local_68._8_4_ = 0x12f;
    local_68._16_8_ = "CfdAddTransactionInput";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_68,"txid is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_68,"Failed to parameter. txid is null or empty.",
               (allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_68);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_48,txid,&local_6a);
      cfd::core::Txid::Txid((Txid *)local_68,&local_48);
      cfd::core::Transaction::AddTxIn
                ((Transaction *)this,(Txid *)local_68,vout,sequence,
                 (Script *)cfd::core::Script::Empty);
    }
    else {
      std::__cxx11::string::string((string *)&local_48,txid,&local_6a);
      cfd::core::Txid::Txid((Txid *)local_68,&local_48);
      cfd::core::ConfidentialTransaction::AddTxIn
                (this,(Txid *)local_68,vout,sequence,(Script *)cfd::core::Script::Empty);
    }
    cfd::core::Txid::~Txid((Txid *)local_68);
    std::__cxx11::string::~string((string *)&local_48);
    return 0;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_68,"Invalid handle state. tx is null",(allocator *)&local_48);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_68);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTransactionInput(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    uint32_t sequence) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddTxIn(Txid(std::string(txid)), vout, sequence);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddTxIn(Txid(std::string(txid)), vout, sequence);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}